

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

void mi_segment_free(mi_segment_t *segment,_Bool force,mi_segments_tld_t *tld)

{
  size_t sVar1;
  undefined7 in_register_00000031;
  mi_segments_tld_t *tld_00;
  size_t total;
  mi_slice_t *slice;
  
  tld_00 = (mi_segments_tld_t *)CONCAT71(in_register_00000031,force);
  if (segment->dont_free == false) {
    sVar1 = segment->slice_entries;
    for (slice = segment->slices; slice < segment->slices + sVar1;
        slice = slice + slice->slice_count) {
      if ((slice->block_size == 0) && (segment->kind != MI_SEGMENT_HUGE)) {
        mi_segment_span_remove_from_queue(slice,tld_00);
      }
    }
    LOCK();
    segment->thread_id = 0;
    UNLOCK();
    _mi_segment_map_freed_at(segment);
    mi_segments_track_size(segment->segment_slices * -0x10000,tld_00);
    if (segment->was_reclaimed == true) {
      tld_00->reclaim_count = tld_00->reclaim_count - 1;
      segment->was_reclaimed = false;
    }
    total = segment->segment_slices << 0x10;
    sVar1 = _mi_commit_mask_committed_size(&segment->commit_mask,total);
    _mi_arena_free(segment,total,sVar1,segment->memid);
  }
  return;
}

Assistant:

static void mi_segment_free(mi_segment_t* segment, bool force, mi_segments_tld_t* tld) {
  MI_UNUSED(force);
  mi_assert_internal(segment != NULL);
  mi_assert_internal(segment->next == NULL);
  mi_assert_internal(segment->used == 0);

  // in `mi_segment_force_abandon` we set this to true to ensure the segment's memory stays valid
  if (segment->dont_free) return;

  // Remove the free pages
  mi_slice_t* slice = &segment->slices[0];
  const mi_slice_t* end = mi_segment_slices_end(segment);
  #if MI_DEBUG>1
  size_t page_count = 0;
  #endif
  while (slice < end) {
    mi_assert_internal(slice->slice_count > 0);
    mi_assert_internal(slice->slice_offset == 0);
    mi_assert_internal(mi_slice_index(slice)==0 || slice->block_size == 0); // no more used pages ..
    if (slice->block_size == 0 && segment->kind != MI_SEGMENT_HUGE) {
      mi_segment_span_remove_from_queue(slice, tld);
    }
    #if MI_DEBUG>1
    page_count++;
    #endif
    slice = slice + slice->slice_count;
  }
  mi_assert_internal(page_count == 2); // first page is allocated by the segment itself

  // stats
  // _mi_stat_decrease(&tld->stats->page_committed, mi_segment_info_size(segment));

  // return it to the OS
  mi_segment_os_free(segment, tld);
}